

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O0

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings
          (VerifierTemplate<false> *this,
          Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec)

{
  bool bVar1;
  uint uVar2;
  return_type str;
  uint local_24;
  uoffset_t i;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_local;
  VerifierTemplate<false> *this_local;
  
  if (vec != (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0) {
    for (local_24 = 0;
        uVar2 = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::size(vec),
        local_24 < uVar2; local_24 = local_24 + 1) {
      str = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(vec,local_24);
      bVar1 = VerifyString(this,str);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool VerifyVectorOfStrings(const Vector<Offset<String>> *const vec) const {
    if (vec) {
      for (uoffset_t i = 0; i < vec->size(); i++) {
        if (!VerifyString(vec->Get(i))) return false;
      }
    }
    return true;
  }